

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O1

bool tinyusdz::io::WriteWholeFile(string *filepath,uchar *contents,size_t content_bytes,string *err)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  char *__lhs;
  ofstream f;
  long *local_268;
  long local_258;
  long lStack_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228;
  filebuf local_220 [24];
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  ::std::ofstream::ofstream((ofstream *)&local_228,(filepath->_M_dataplus)._M_p,_S_bin);
  if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) == 0) {
    ::std::ostream::write((char *)&local_228,(long)contents);
    if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) == 0) {
      bVar3 = true;
      goto LAB_002bec02;
    }
    if (err != (string *)0x0) {
      __lhs = "File write error: ";
      goto LAB_002beb5a;
    }
  }
  else if (err != (string *)0x0) {
    __lhs = "File open error for writing : ";
LAB_002beb5a:
    ::std::operator+(&local_248,__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filepath);
    plVar1 = (long *)::std::__cxx11::string::append((char *)&local_248);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_258 = *plVar2;
      lStack_250 = plVar1[3];
      local_268 = &local_258;
    }
    else {
      local_258 = *plVar2;
      local_268 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_268);
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = false;
LAB_002bec02:
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  ::std::filebuf::~filebuf(local_220);
  ::std::ios_base::~ios_base(local_130);
  return bVar3;
}

Assistant:

bool WriteWholeFile(const std::string &filepath, const unsigned char *contents,
                    size_t content_bytes, std::string *err) {
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor = _wopen(UTF8ToWchar(filepath).c_str(),
                               _O_CREAT | _O_WRONLY | _O_TRUNC | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(
      file_descriptor, std::ios_base::out | std::ios_base::binary);
  std::ostream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  std::ofstream f(UTF8ToWchar(filepath).c_str(), std::ofstream::binary);
#else  // other C++ compiler for win32?
  std::ofstream f(filepath.c_str(), std::ofstream::binary);
#endif
#else
  std::ofstream f(filepath.c_str(), std::ofstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File open error for writing : " + filepath + "\n";
    }
    return false;
  }

  f.write(reinterpret_cast<const char *>(contents),
          static_cast<std::streamsize>(content_bytes));
  if (!f) {
    if (err) {
      (*err) += "File write error: " + filepath + "\n";
    }
    return false;
  }

  return true;
}